

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

string * __thiscall kratos::Param::value_str_abi_cxx11_(string *__return_storage_ptr__,Param *this)

{
  bool bVar1;
  Param *pPVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  Param *p;
  Param *this_local;
  
  if (this->param_type_ == Integral) {
    Const::to_string_abi_cxx11_(__return_storage_ptr__,&this->super_Const);
  }
  else if (this->parent_param_ == (Param *)0x0) {
    if (this->param_type_ == RawType) {
      bVar1 = std::optional::operator_cast_to_bool((optional *)&this->raw_str_value_);
      if (bVar1) {
        pbVar3 = std::
                 optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&this->raw_str_value_);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar3);
        return __return_storage_ptr__;
      }
      bVar1 = std::optional::operator_cast_to_bool((optional *)&this->initial_raw_str_value_);
      if (bVar1) {
        pbVar3 = std::
                 optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&this->initial_raw_str_value_);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar3);
        return __return_storage_ptr__;
      }
    }
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&(this->super_Const).super_Var.name);
  }
  else {
    pPVar2 = parent_param(this);
    (*(pPVar2->super_Const).super_Var.super_IRNode._vptr_IRNode[0x1f])(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Param::value_str() const {
    if (param_type_ == ParamType::Integral) {
        return Const::to_string();
    } else if (parent_param_) {
        const auto *p = parent_param();
        return p->to_string();
    } else {
        // raw type
        if (param_type_ == ParamType::RawType) {
            if (raw_str_value_) return *raw_str_value_;
            if (initial_raw_str_value_) return *initial_raw_str_value_;
        }
        return name;
    }
}